

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O3

ostream * __thiscall wasm::anon_unknown_0::TypePrinter::print(TypePrinter *this,Type type)

{
  HeapType type_00;
  ostream *poVar1;
  long lVar2;
  char *pcVar3;
  Type local_28;
  Type type_local;
  
  local_28.id = type.id;
  if (6 < type.id) {
    if (*(char *)type.id == '\x01') {
      std::__ostream_insert<char,std::char_traits<char>>(this->os,"(; temp ;) ",0xb);
    }
    if (*(int *)(type.id + 4) == 1) {
      type_00 = wasm::Type::getHeapType(&local_28);
      if ((((type_00.id < 0xe) && (6 < local_28.id)) && (*(int *)(local_28.id + 4) == 1)) &&
         (*(int *)(local_28.id + 0x10) != 0)) {
        poVar1 = (ostream *)
                 (*(code *)(&DAT_00bab7d0 + *(int *)(&DAT_00bab7d0 + (type_00.id & 0xffffffff) * 4))
                 )();
        return poVar1;
      }
      std::__ostream_insert<char,std::char_traits<char>>(this->os,"(ref ",5);
      if (((6 < local_28.id) && (*(int *)(local_28.id + 4) == 1)) &&
         (*(int *)(local_28.id + 0x10) != 0)) {
        std::__ostream_insert<char,std::char_traits<char>>(this->os,"null ",5);
      }
      printHeapTypeName(this,type_00);
      type_local.id._7_1_ = 0x29;
      std::__ostream_insert<char,std::char_traits<char>>
                (this->os,(char *)((long)&type_local.id + 7),1);
    }
    else {
      if (*(int *)(type.id + 4) != 0) {
        handle_unreachable("unexpected type",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wasm-type.cpp"
                           ,0x769);
      }
      print(this,(Tuple *)(type.id + 8));
    }
    return this->os;
  }
  poVar1 = this->os;
  switch(type.id) {
  case 0:
    pcVar3 = "none";
    goto LAB_009bac8f;
  case 1:
    pcVar3 = "unreachable";
    lVar2 = 0xb;
    goto LAB_009bac94;
  case 2:
    pcVar3 = "i32";
    break;
  case 3:
    pcVar3 = "i64";
    break;
  case 4:
    pcVar3 = "f32";
    break;
  case 5:
    pcVar3 = "f64";
    break;
  case 6:
    pcVar3 = "v128";
LAB_009bac8f:
    lVar2 = 4;
    goto LAB_009bac94;
  }
  lVar2 = 3;
LAB_009bac94:
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar3,lVar2);
  return poVar1;
}

Assistant:

std::ostream& TypePrinter::print(Type type) {
  if (type.isBasic()) {
    switch (type.getBasic()) {
      case Type::none:
        return os << "none";
      case Type::unreachable:
        return os << "unreachable";
      case Type::i32:
        return os << "i32";
      case Type::i64:
        return os << "i64";
      case Type::f32:
        return os << "f32";
      case Type::f64:
        return os << "f64";
      case Type::v128:
        return os << "v128";
    }
  }

  if (isTemp(type)) {
    os << "(; temp ;) ";
  }
#if TRACE_CANONICALIZATION
  os << "(;" << ((type.getID() >> 4) % 1000) << ";) ";
#endif
  if (type.isTuple()) {
    print(type.getTuple());
  } else if (type.isRef()) {
    auto heapType = type.getHeapType();
    if (heapType.isBasic()) {
      // Print shorthands for certain basic heap types.
      if (type.isNullable()) {
        switch (heapType.getBasic()) {
          case HeapType::ext:
            return os << "externref";
          case HeapType::func:
            return os << "funcref";
          case HeapType::any:
            return os << "anyref";
          case HeapType::eq:
            return os << "eqref";
          case HeapType::i31:
            return os << "i31ref";
          case HeapType::struct_:
            return os << "structref";
          case HeapType::array:
            return os << "arrayref";
          case HeapType::string:
            return os << "stringref";
          case HeapType::stringview_wtf8:
            return os << "stringview_wtf8";
          case HeapType::stringview_wtf16:
            return os << "stringview_wtf16";
          case HeapType::stringview_iter:
            return os << "stringview_iter";
          case HeapType::none:
            return os << "nullref";
          case HeapType::noext:
            return os << "nullexternref";
          case HeapType::nofunc:
            return os << "nullfuncref";
        }
      }
    }
    os << "(ref ";
    if (type.isNullable()) {
      os << "null ";
    }
    printHeapTypeName(heapType);
    os << ')';
  } else {
    WASM_UNREACHABLE("unexpected type");
  }
  return os;
}